

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O3

bool __thiscall ForbiddenPointFinder::isDoubleThree(ForbiddenPointFinder *this,int x,int y)

{
  bool bVar1;
  int i;
  int nDir;
  uint uVar2;
  
  if (this->cBoard[(long)x + 1][(long)y + 1] == Empty) {
    uVar2 = 0;
    bVar1 = isFive(this,x,y,0);
    if (!bVar1) {
      nDir = 1;
      do {
        bVar1 = isOpenThree(this,x,y,0,nDir);
        uVar2 = uVar2 + bVar1;
        nDir = nDir + 1;
      } while (nDir != 5);
      uVar2 = (uint)(1 < uVar2);
    }
  }
  else {
    uVar2 = 0;
  }
  return SUB41(uVar2,0);
}

Assistant:

bool ForbiddenPointFinder::isDoubleThree(int x, int y) {
    if (cBoard[x + 1][y + 1] != Stone::Empty)
        return false;

    if (isFive(x, y, 0))    // five?
        return false;

    int nThree = 0;
    for (int i = 1; i <= 4; i++) {
        if (isOpenThree(x, y, 0, i))
            nThree++;
    }

    if (nThree >= 2)
        return true;
    else
        return false;
}